

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  Option *opt_00;
  pointer piVar6;
  int iVar7;
  int iVar8;
  Allocator *pAVar9;
  ulong uVar10;
  Mat *pMVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  void *pvVar17;
  int iVar18;
  size_t __size;
  Mat *pMVar19;
  long lVar20;
  void *pvVar21;
  int iVar22;
  int iVar23;
  void *pvVar24;
  void *pvVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  size_type __n;
  long lVar29;
  ulong uVar30;
  int *piVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  uint uVar36;
  undefined4 uVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  void *local_230;
  int size_3;
  undefined1 local_218 [32];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  Mat *local_1d8;
  Mat *local_1d0;
  Mat *local_1c8;
  long local_1c0;
  float *local_1b8;
  void *local_1b0;
  void *local_1a8;
  ulong local_1a0;
  ulong local_198;
  long local_190;
  int remain;
  Mat *local_180;
  ulong local_178;
  Mat *local_170;
  Mat local_168;
  ulong local_128;
  ulong local_120;
  void *local_118;
  void *local_110;
  int local_104;
  int local_100;
  int local_fc;
  Mat *local_f8;
  Option *local_f0;
  ulong local_e8;
  void *local_e0;
  long local_d8;
  float *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  long local_a8;
  void *local_a0;
  Mat *local_98;
  void *local_90;
  void *local_88;
  long local_80;
  int remain_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_b;
  
  local_180 = (Mat *)(ulong)(uint)bottom_blob->c;
  if (bottom_blob->c % this->group != 0) {
    return -100;
  }
  iVar8 = this->num_output;
  if (iVar8 % this->group != 0) {
    return -100;
  }
  local_1c0 = (long)bottom_blob->w;
  local_170 = (Mat *)(ulong)(uint)bottom_blob->h;
  pMVar11 = (Mat *)bottom_blob->elemsize;
  iVar22 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w + -1) * this->stride_w + 1;
  iVar7 = (bottom_blob->h - 1U) * this->stride_h;
  iVar12 = (this->kernel_h + -1) * this->dilation_h + iVar7 + 1;
  local_218._16_8_ = (Mat *)0x0;
  local_218._24_4_ = 0;
  local_218._0_8_ = (void *)0x0;
  local_218._8_4_ = 0;
  local_218._12_4_ = 0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  auVar40._0_4_ = -(uint)(0 < this->pad_left);
  auVar40._4_4_ = -(uint)(0 < this->pad_right);
  auVar40._8_4_ = -(uint)(0 < this->pad_top);
  auVar40._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar7 = movmskps(iVar7,auVar40);
  local_1d0 = bottom_blob;
  if ((((iVar7 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    if ((Mat *)local_218 == top_blob) {
      piVar31 = (int *)0x0;
      bVar35 = true;
      pAVar9 = (Allocator *)0x0;
      bVar34 = false;
      iVar13 = 0;
      iVar27 = 0;
      iVar7 = 0;
      bVar33 = false;
    }
    else {
      piVar31 = top_blob->refcount;
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_218._0_8_ = top_blob->data;
      piVar31 = top_blob->refcount;
      local_218._8_4_ = SUB84(piVar31,0);
      local_218._12_4_ = (undefined4)((ulong)piVar31 >> 0x20);
      local_218._16_8_ = top_blob->elemsize;
      local_218._24_4_ = top_blob->elempack;
      pAVar9 = top_blob->allocator;
      iVar7 = top_blob->w;
      local_1f8._0_8_ = top_blob->allocator;
      local_1f8._8_4_ = top_blob->dims;
      local_1f8._12_4_ = top_blob->w;
      iVar27 = top_blob->h;
      iVar13 = top_blob->c;
      local_1e8._0_4_ = top_blob->h;
      local_1e8._4_4_ = top_blob->c;
      local_1e8._8_8_ = top_blob->cstep;
      iVar8 = this->num_output;
      bVar33 = top_blob->dims == 3;
      bVar34 = local_218._24_4_ == 1;
      bVar35 = (void *)local_218._0_8_ == (void *)0x0;
    }
    pAVar3 = opt->blob_allocator;
    if (!(bool)((Mat *)local_218._16_8_ == pMVar11 & bVar34 &
                (iVar13 == iVar8 && iVar27 == iVar12) & iVar7 == iVar22 & bVar33 & pAVar9 == pAVar3)
       ) {
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + -1;
        UNLOCK();
        if (*piVar31 == 0) {
          if ((Allocator *)local_1f8._0_8_ == (Allocator *)0x0) {
            if ((void *)local_218._0_8_ != (void *)0x0) {
              free((void *)local_218._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_1f8._0_8_ + 0x18))();
          }
        }
      }
      local_218._0_8_ = (void *)0x0;
      local_218._8_4_ = 0;
      local_218._12_4_ = 0;
      local_218._24_4_ = 1;
      local_1f8._8_4_ = 3;
      local_1f8._0_8_ = pAVar3;
      local_1f8._12_4_ = iVar22;
      local_1e8._4_4_ = iVar8;
      local_1e8._0_4_ = iVar12;
      local_1e8._8_8_ =
           ((long)(iVar12 * iVar22) * (long)pMVar11 + 0xfU & 0xfffffffffffffff0) / (ulong)pMVar11;
      lVar29 = (long)iVar8 * local_1e8._8_8_;
      if (lVar29 == 0) {
        return -100;
      }
      uVar30 = lVar29 * (long)pMVar11 + 3U & 0xfffffffffffffffc;
      __size = uVar30 + 4;
      if (pAVar3 == (Allocator *)0x0) goto LAB_0016ab2f;
      local_218._16_8_ = pMVar11;
      local_218._0_8_ = (**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,__size);
      goto LAB_0016ab53;
    }
    iVar8 = -100;
    if (bVar35) goto LAB_0016bb41;
  }
  else {
    local_1f8._0_8_ = opt->workspace_allocator;
    local_218._0_8_ = (void *)0x0;
    local_218._8_4_ = 0;
    local_218._12_4_ = 0;
    local_218._24_4_ = 1;
    local_1f8._8_4_ = 3;
    local_1f8._12_4_ = iVar22;
    local_1e8._4_4_ = iVar8;
    local_1e8._0_4_ = iVar12;
    local_1e8._8_8_ =
         ((long)(iVar12 * iVar22) * (long)pMVar11 + 0xfU & 0xfffffffffffffff0) / (ulong)pMVar11;
    lVar29 = (long)iVar8 * local_1e8._8_8_;
    if (lVar29 == 0) {
      return -100;
    }
    uVar30 = lVar29 * (long)pMVar11 + 3U & 0xfffffffffffffffc;
    __size = uVar30 + 4;
    if ((Allocator *)local_1f8._0_8_ == (Allocator *)0x0) {
LAB_0016ab2f:
      local_218._24_4_ = 1;
      local_218._12_4_ = 0;
      local_218._8_4_ = 0;
      local_218._0_8_ = (void *)0x0;
      local_168.data = (void *)0x0;
      local_218._16_8_ = pMVar11;
      iVar8 = posix_memalign(&local_168.data,0x10,__size);
      local_218._0_8_ = (void *)0x0;
      if (iVar8 == 0) {
        local_218._0_8_ = local_168.data;
      }
    }
    else {
      local_218._16_8_ = pMVar11;
      local_218._0_8_ = (**(code **)(*(long *)local_1f8._0_8_ + 0x10))(local_1f8._0_8_,__size);
    }
LAB_0016ab53:
    piVar31 = (int *)(uVar30 + local_218._0_8_);
    *piVar31 = 1;
    local_218._8_8_ = piVar31;
  }
  if ((long)(int)local_1e8._4_4_ * local_1e8._8_8_ == 0) {
    iVar8 = -100;
    goto LAB_0016bb41;
  }
  uVar32 = this->kernel_w * this->kernel_h;
  __n = (size_type)(int)uVar32;
  local_f0 = opt;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&local_168);
  piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar8 = this->kernel_h;
  if (0 < iVar8) {
    iVar7 = this->dilation_h;
    iVar27 = this->kernel_w;
    iVar13 = this->dilation_w * iVar27;
    iVar14 = 0;
    iVar18 = 0;
    iVar23 = 0;
    do {
      if (0 < iVar27) {
        lVar29 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar14 + lVar29] = iVar18;
          iVar18 = iVar18 + this->dilation_w;
          iVar27 = this->kernel_w;
          lVar29 = lVar29 + 1;
        } while ((int)lVar29 < iVar27);
        iVar14 = iVar14 + (int)lVar29;
        iVar8 = this->kernel_h;
      }
      iVar18 = iVar18 + (iVar7 * iVar22 - iVar13);
      iVar23 = iVar23 + 1;
    } while (iVar23 < iVar8);
  }
  uVar15 = this->group;
  uVar36 = (uint)local_180;
  local_f8 = top_blob;
  if (uVar15 == this->num_output && uVar36 == uVar15) {
    pMVar11 = local_180;
    if (0 < (int)uVar36) {
      local_c8._0_8_ = local_1d0->data;
      local_118 = (void *)(local_1d0->cstep * local_1d0->elemsize);
      pvVar21 = (this->weight_data).data;
      local_1c8 = (Mat *)local_218._16_8_;
      local_1d0 = (Mat *)(local_1e8._8_8_ * local_218._16_8_);
      local_1a0 = CONCAT44(local_1a0._4_4_,local_1f8._12_4_);
      _remain = (void *)(ulong)(uint)(local_1e8._0_4_ * local_1f8._12_4_);
      local_190 = CONCAT44(local_190._4_4_,this->bias_term);
      local_1b0 = (this->bias_data).data;
      uVar15 = iVar12 * iVar22;
      uVar30 = (ulong)uVar15;
      local_1b8 = (float *)(this->activation_params).data;
      local_198 = (ulong)(local_1e8._0_4_ * local_1f8._12_4_ + 3 & 0xfffffffc);
      lVar29 = (long)_remain - 1;
      auVar45._8_4_ = (int)lVar29;
      auVar45._0_8_ = lVar29;
      auVar45._12_4_ = (int)((ulong)lVar29 >> 0x20);
      pvVar25 = (void *)(local_218._0_8_ + 0xc);
      auVar45 = auVar45 ^ _DAT_00175220;
      local_178 = (ulong)(this->activation_type - 1);
      pMVar19 = (Mat *)0x0;
      local_1a8 = (void *)local_218._0_8_;
      pvVar24 = (void *)local_218._0_8_;
      auVar46 = _DAT_00175230;
      auVar39 = _DAT_00175240;
      auVar40 = _DAT_00175220;
      local_b8 = auVar45;
      do {
        uVar37 = 0;
        if ((int)local_190 != 0) {
          uVar37 = *(undefined4 *)((long)local_1b0 + (long)pMVar19 * 4);
        }
        if (0 < remain) {
          uVar10 = 0;
          do {
            auVar41._8_4_ = (int)uVar10;
            auVar41._0_8_ = uVar10;
            auVar41._12_4_ = (int)(uVar10 >> 0x20);
            auVar44 = (auVar41 | auVar39) ^ auVar40;
            iVar8 = auVar45._4_4_;
            if ((bool)(~(iVar8 < auVar44._4_4_ ||
                        auVar45._0_4_ < auVar44._0_4_ && auVar44._4_4_ == iVar8) & 1)) {
              *(undefined4 *)((long)pvVar25 + uVar10 * 4 + -0xc) = uVar37;
            }
            if (auVar44._12_4_ <= auVar45._12_4_ &&
                (auVar44._8_4_ <= auVar45._8_4_ || auVar44._12_4_ != auVar45._12_4_)) {
              *(undefined4 *)((long)pvVar25 + uVar10 * 4 + -8) = uVar37;
            }
            auVar44 = (auVar41 | auVar46) ^ auVar40;
            iVar7 = auVar44._4_4_;
            if (iVar7 <= iVar8 && (iVar7 != iVar8 || auVar44._0_4_ <= auVar45._0_4_)) {
              *(undefined4 *)((long)pvVar25 + uVar10 * 4 + -4) = uVar37;
              *(undefined4 *)((long)pvVar25 + uVar10 * 4) = uVar37;
            }
            uVar10 = uVar10 + 4;
          } while (local_198 != uVar10);
        }
        if (0 < (int)local_170) {
          iVar8 = this->stride_h;
          iVar7 = this->stride_w;
          pMVar11 = (Mat *)0x0;
          do {
            if (0 < (int)local_1c0) {
              lVar29 = 0;
              do {
                if (0 < (int)uVar32) {
                  lVar28 = lVar29 * iVar7 * 4 +
                           (long)(int)(iVar8 * (uint)local_1a0 * (int)pMVar11) * (long)local_1c8 +
                           (long)local_1d0 * (long)pMVar19;
                  uVar10 = 0;
                  do {
                    lVar20 = (long)piVar6[uVar10];
                    *(float *)((long)local_1a8 + lVar20 * 4 + lVar28) =
                         *(float *)((long)pvVar21 + uVar10 * 4) *
                         *(float *)((long)local_118 * (long)pMVar19 + local_c8._0_8_ +
                                    (long)pMVar11 * local_1c0 * 4 + lVar29 * 4) +
                         *(float *)((long)local_1a8 + lVar20 * 4 + lVar28);
                    uVar10 = uVar10 + 1;
                  } while (uVar32 != uVar10);
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != local_1c0);
            }
            pMVar11 = (Mat *)((long)&pMVar11->data + 1);
          } while (pMVar11 != local_170);
        }
        local_1d8 = pMVar19;
        local_110 = pvVar25;
        if ((uint)local_178 < 4) {
          switch((long)&switchD_0016af50::switchdataD_00176c5c +
                 (long)(int)(&switchD_0016af50::switchdataD_00176c5c)[local_178]) {
          case 0x16af52:
            if (0 < (int)uVar15) {
              uVar10 = 0;
              do {
                fVar38 = *(float *)((long)pvVar24 + uVar10 * 4);
                if (fVar38 <= 0.0) {
                  fVar38 = 0.0;
                }
                *(float *)((long)pvVar24 + uVar10 * 4) = fVar38;
                uVar10 = uVar10 + 1;
              } while (uVar30 != uVar10);
            }
            break;
          case 0x16af7b:
            if (0 < (int)uVar15) {
              fVar38 = *local_1b8;
              fVar1 = local_1b8[1];
              uVar10 = 0;
              do {
                fVar2 = *(float *)((long)pvVar24 + uVar10 * 4);
                fVar43 = fVar2;
                if (fVar2 <= fVar38) {
                  fVar43 = fVar38;
                }
                if ((fVar2 < fVar38) || (fVar1 < fVar43)) {
                  if (fVar1 <= fVar43) {
                    fVar43 = fVar1;
                  }
                  *(float *)((long)pvVar24 + uVar10 * 4) = fVar43;
                }
                uVar10 = uVar10 + 1;
              } while (uVar30 != uVar10);
            }
            break;
          case 0x16afbf:
            if (0 < (int)uVar15) {
              fVar38 = *local_1b8;
              uVar10 = 0;
              do {
                fVar1 = *(float *)((long)pvVar24 + uVar10 * 4);
                uVar36 = -(uint)(0.0 < fVar1);
                *(float *)((long)pvVar24 + uVar10 * 4) =
                     (float)(~uVar36 & (uint)fVar38 | uVar36 & 0x3f800000) * fVar1;
                uVar10 = uVar10 + 1;
              } while (uVar30 != uVar10);
            }
            break;
          case 0x16b00a:
            if (0 < (int)uVar15) {
              uVar10 = 0;
              do {
                fVar38 = expf((float)(*(uint *)((long)pvVar24 + uVar10 * 4) ^ auVar40._0_4_));
                auVar39 = _DAT_00175240;
                auVar46 = _DAT_00175230;
                auVar40 = _DAT_00175220;
                *(float *)((long)pvVar24 + uVar10 * 4) = 1.0 / (fVar38 + 1.0);
                uVar10 = uVar10 + 1;
                auVar45 = local_b8;
              } while (uVar30 != uVar10);
            }
          }
        }
        pMVar19 = (Mat *)((long)&local_1d8->data + 1);
        pvVar25 = (void *)((long)local_110 + (long)local_1d0);
        pvVar21 = (void *)((long)pvVar21 + __n * 4);
        pvVar24 = (void *)((long)pvVar24 + (long)local_1d0);
        pMVar11 = local_1d0;
      } while (pMVar19 != local_180);
    }
  }
  else {
    local_e8 = (ulong)uVar15;
    uVar30 = (long)((ulong)(uint)((int)uVar36 >> 0x1f) << 0x20 | (ulong)local_180 & 0xffffffff) /
             (long)(int)uVar15;
    pMVar11 = (Mat *)(uVar30 & 0xffffffff);
    iVar8 = (int)uVar30;
    if (0 < (int)uVar15) {
      uVar10 = (long)this->num_output / (long)(int)uVar15;
      local_1b0 = (void *)(uVar10 & 0xffffffff);
      local_180 = (Mat *)local_218._16_8_;
      local_1a8 = (void *)(local_1e8._8_8_ * local_218._16_8_);
      local_100 = local_1f8._12_4_;
      _remain_1 = (ulong)(uint)(local_1e8._0_4_ * local_1f8._12_4_);
      local_a0 = (this->weight_data).data;
      local_fc = this->bias_term;
      uVar15 = iVar12 * iVar22;
      pMVar19 = (Mat *)(ulong)uVar15;
      local_104 = (int)uVar10;
      local_a8 = (long)local_104;
      uVar10 = (ulong)(local_1e8._0_4_ * local_1f8._12_4_ + 3 & 0xfffffffc);
      lVar29 = _remain_1 - 1;
      auVar44._8_4_ = (int)lVar29;
      auVar44._0_8_ = lVar29;
      auVar44._12_4_ = (int)((ulong)lVar29 >> 0x20);
      local_98 = (Mat *)((long)local_1a8 * local_a8);
      local_104 = local_104 * iVar8 * uVar32;
      local_80 = (long)(int)(iVar8 * uVar32) << 2;
      auVar44 = auVar44 ^ _DAT_00175220;
      local_1a0 = (ulong)(this->activation_type - 1);
      local_d8 = local_218._0_8_ + 0xc;
      local_120 = 0;
      local_90 = (void *)local_218._0_8_;
      local_e0 = (void *)local_218._0_8_;
      local_128 = 0;
      auVar46 = _DAT_00175230;
      auVar39 = _DAT_00175240;
      auVar40 = _DAT_00175220;
      local_198 = uVar10;
      local_c8 = auVar44;
      do {
        if (0 < (int)local_1b0) {
          local_230 = (void *)((long)local_a0 + (long)(int)local_120 * 4);
          local_1b8 = (float *)(local_128 * local_a8);
          local_d0 = (float *)(this->activation_params).data;
          local_88 = (this->bias_data).data;
          iVar7 = (int)local_128;
          pvVar21 = (void *)0x0;
          pvVar25 = local_e0;
          lVar29 = local_d8;
          do {
            if (local_fc == 0) {
              uVar37 = 0;
            }
            else {
              uVar37 = *(undefined4 *)((long)local_88 + ((long)pvVar21 + (long)local_1b8) * 4);
            }
            if (0 < remain_1) {
              uVar16 = 0;
              do {
                auVar42._8_4_ = (int)uVar16;
                auVar42._0_8_ = uVar16;
                auVar42._12_4_ = (int)(uVar16 >> 0x20);
                auVar45 = (auVar42 | auVar39) ^ auVar40;
                iVar12 = auVar44._4_4_;
                if ((bool)(~(iVar12 < auVar45._4_4_ ||
                            auVar44._0_4_ < auVar45._0_4_ && auVar45._4_4_ == iVar12) & 1)) {
                  *(undefined4 *)(lVar29 + -0xc + uVar16 * 4) = uVar37;
                }
                if (auVar45._12_4_ <= auVar44._12_4_ &&
                    (auVar45._8_4_ <= auVar44._8_4_ || auVar45._12_4_ != auVar44._12_4_)) {
                  *(undefined4 *)(lVar29 + -8 + uVar16 * 4) = uVar37;
                }
                auVar42 = (auVar42 | auVar46) ^ auVar40;
                iVar22 = auVar42._4_4_;
                if (iVar22 <= iVar12 && (iVar22 != iVar12 || auVar42._0_4_ <= auVar44._0_4_)) {
                  *(undefined4 *)(lVar29 + -4 + uVar16 * 4) = uVar37;
                  *(undefined4 *)(lVar29 + uVar16 * 4) = uVar37;
                }
                uVar16 = uVar16 + 4;
              } while (uVar10 != uVar16);
            }
            if (0 < (int)local_170) {
              local_110 = (void *)(((long)pvVar21 + (long)local_1b8) * (long)local_1a8 +
                                  (long)local_90);
              iVar22 = this->stride_h * local_100;
              local_178 = CONCAT44(local_178._4_4_,iVar22);
              iVar12 = this->stride_w;
              local_b8._0_8_ = (long)iVar12;
              local_1d8 = (Mat *)0x0;
              do {
                if (0 < (int)local_1c0) {
                  local_1c8 = (Mat *)((long)(iVar22 * (int)local_1d8) * (long)local_180 +
                                     (long)local_110);
                  iVar27 = local_1d0->w;
                  sVar5 = local_1d0->elemsize;
                  sVar4 = local_1d0->cstep;
                  pvVar24 = local_1d0->data;
                  lVar28 = 0;
                  do {
                    if (0 < iVar8) {
                      lVar20 = lVar28 * iVar12;
                      uVar10 = 0;
                      pvVar17 = local_230;
                      do {
                        if (0 < (int)uVar32) {
                          fVar38 = *(float *)((long)pvVar24 +
                                             (uVar10 + (uint)(iVar8 * iVar7)) * sVar4 * sVar5 +
                                             lVar28 * 4 + (long)iVar27 * (long)local_1d8 * sVar5);
                          uVar16 = 0;
                          do {
                            lVar26 = (long)piVar6[uVar16];
                            *(float *)((long)&local_1c8->data + lVar26 * 4 + lVar20 * 4) =
                                 *(float *)((long)pvVar17 + uVar16 * 4) * fVar38 +
                                 *(float *)((long)&local_1c8->data + lVar26 * 4 + lVar20 * 4);
                            uVar16 = uVar16 + 1;
                          } while (uVar32 != uVar16);
                        }
                        uVar10 = uVar10 + 1;
                        pvVar17 = (void *)((long)pvVar17 + __n * 4);
                      } while (uVar10 != (uVar30 & 0xffffffff));
                    }
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != local_1c0);
                }
                local_1d8 = (Mat *)((long)&local_1d8->data + 1);
              } while (local_1d8 != local_170);
            }
            local_190 = lVar29;
            _remain = pvVar25;
            local_118 = pvVar21;
            if ((uint)local_1a0 < 4) {
              switch((long)&switchD_0016b524::switchdataD_00176c4c +
                     (long)(int)(&switchD_0016b524::switchdataD_00176c4c)[local_1a0]) {
              case 0x16b526:
                if (0 < (int)uVar15) {
                  pMVar11 = (Mat *)0x0;
                  do {
                    fVar38 = *(float *)((long)pvVar25 + (long)pMVar11 * 4);
                    if (fVar38 <= 0.0) {
                      fVar38 = 0.0;
                    }
                    *(float *)((long)pvVar25 + (long)pMVar11 * 4) = fVar38;
                    pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                  } while (pMVar19 != pMVar11);
                }
                break;
              case 0x16b54f:
                if (0 < (int)uVar15) {
                  fVar38 = *local_d0;
                  fVar1 = local_d0[1];
                  pMVar11 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)pvVar25 + (long)pMVar11 * 4);
                    fVar43 = fVar2;
                    if (fVar2 <= fVar38) {
                      fVar43 = fVar38;
                    }
                    if ((fVar2 < fVar38) || (fVar1 < fVar43)) {
                      if (fVar1 <= fVar43) {
                        fVar43 = fVar1;
                      }
                      *(float *)((long)pvVar25 + (long)pMVar11 * 4) = fVar43;
                    }
                    pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                  } while (pMVar19 != pMVar11);
                }
                break;
              case 0x16b593:
                if (0 < (int)uVar15) {
                  pMVar11 = (Mat *)0x0;
                  do {
                    local_1c8 = pMVar11;
                    fVar38 = expf((float)(*(uint *)((long)_remain + (long)pMVar11 * 4) ^
                                         auVar40._0_4_));
                    auVar39 = _DAT_00175240;
                    auVar46 = _DAT_00175230;
                    auVar40 = _DAT_00175220;
                    *(float *)((long)_remain + (long)local_1c8 * 4) = 1.0 / (fVar38 + 1.0);
                    pMVar11 = (Mat *)((long)&local_1c8->data + 1);
                    auVar44 = local_c8;
                  } while (pMVar19 != pMVar11);
                }
                break;
              case 0x16b619:
                if (0 < (int)uVar15) {
                  fVar38 = *local_d0;
                  pMVar11 = (Mat *)0x0;
                  do {
                    fVar1 = *(float *)((long)pvVar25 + (long)pMVar11 * 4);
                    uVar36 = -(uint)(0.0 < fVar1);
                    *(float *)((long)pvVar25 + (long)pMVar11 * 4) =
                         (float)(~uVar36 & (uint)fVar38 | uVar36 & 0x3f800000) * fVar1;
                    pMVar11 = (Mat *)((long)&pMVar11->data + 1);
                  } while (pMVar19 != pMVar11);
                }
              }
            }
            pvVar21 = (void *)((long)local_118 + 1);
            lVar29 = local_190 + (long)local_1a8;
            local_230 = (void *)((long)local_230 + local_80);
            pvVar25 = (void *)((long)_remain + (long)local_1a8);
            uVar10 = local_198;
          } while (pvVar21 != local_1b0);
        }
        local_128 = local_128 + 1;
        local_d8 = (long)&local_98->data + local_d8;
        local_120 = (ulong)(uint)((int)local_120 + local_104);
        local_e0 = (void *)((long)local_e0 + (long)local_98);
        pMVar11 = local_98;
      } while (local_128 != local_e8);
    }
  }
  opt_00 = local_f0;
  pMVar19 = local_f8;
  auVar46 = local_1e8;
  auVar40 = local_1f8;
  auVar39._0_4_ = -(uint)(0 < this->pad_left);
  auVar39._4_4_ = -(uint)(0 < this->pad_right);
  auVar39._8_4_ = -(uint)(0 < this->pad_top);
  auVar39._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar8 = movmskps((int)pMVar11,auVar39);
  if (iVar8 == 0) {
    if ((this->output_w < 1) || (this->output_h < 1)) {
      if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
        Mat::operator=(local_f8,(Mat *)local_218);
      }
      else {
        copy_make_border((Mat *)local_218,local_f8,0,this->output_pad_bottom,0,
                         this->output_pad_right,0,0.0,local_f0);
        iVar8 = -100;
        if ((pMVar19->data == (void *)0x0) || ((long)pMVar19->c * pMVar19->cstep == 0))
        goto LAB_0016bb1f;
      }
    }
    else {
      local_168.data = (void *)local_218._0_8_;
      local_168.elemsize = local_218._16_8_;
      local_168.elempack = local_218._24_4_;
      local_168.allocator = (Allocator *)local_1f8._0_8_;
      local_168.dims = local_1f8._8_4_;
      local_168.w = local_1f8._12_4_;
      local_168.h = local_1e8._0_4_;
      local_168.c = local_1e8._4_4_;
      local_168.cstep = local_1e8._8_8_;
      if ((int *)local_218._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_218._8_8_ = *(int *)local_218._8_8_ + 1;
        UNLOCK();
      }
      local_1f8 = auVar40;
      local_1e8 = auVar46;
      local_168.refcount = (int *)local_218._8_8_;
      if (0 < this->output_pad_bottom || 0 < this->output_pad_right) {
        opt_b.use_int8_arithmetic = local_f0->use_int8_arithmetic;
        opt_b.use_packing_layout = local_f0->use_packing_layout;
        opt_b.use_shader_pack8 = local_f0->use_shader_pack8;
        opt_b.use_bf16_storage = local_f0->use_bf16_storage;
        opt_b._36_4_ = *(undefined4 *)&local_f0->field_0x24;
        opt_b.lightmode = local_f0->lightmode;
        opt_b._1_3_ = *(undefined3 *)&local_f0->field_0x1;
        opt_b.num_threads = local_f0->num_threads;
        opt_b.workspace_allocator = local_f0->workspace_allocator;
        opt_b.use_winograd_convolution = local_f0->use_winograd_convolution;
        opt_b.use_sgemm_convolution = local_f0->use_sgemm_convolution;
        opt_b.use_int8_inference = local_f0->use_int8_inference;
        opt_b.use_vulkan_compute = local_f0->use_vulkan_compute;
        opt_b.use_fp16_packed = local_f0->use_fp16_packed;
        opt_b.use_fp16_storage = local_f0->use_fp16_storage;
        opt_b.use_fp16_arithmetic = local_f0->use_fp16_arithmetic;
        opt_b.use_int8_storage = local_f0->use_int8_storage;
        opt_b.blob_allocator = local_f0->workspace_allocator;
        copy_make_border((Mat *)local_218,&local_168,0,this->output_pad_bottom,0,
                         this->output_pad_right,0,0.0,&opt_b);
        if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0))
        goto LAB_0016bad6;
      }
      iVar7 = local_168.w - this->output_w;
      iVar8 = local_168.h - this->output_h;
      if ((this->pad_left == -0xe9) ||
         (((this->pad_right == -0xe9 || (this->pad_top == -0xe9)) || (this->pad_bottom == -0xe9))))
      {
        iVar22 = iVar8 / 2;
        iVar12 = iVar8 - iVar22;
        iVar27 = iVar7 / 2;
        iVar8 = iVar7 - iVar27;
LAB_0016ba3b:
        copy_cut_border(&local_168,pMVar19,iVar22,iVar12,iVar27,iVar8,opt_00);
      }
      else if ((this->pad_top == -0xea || (this->pad_right == -0xea || this->pad_left == -0xea)) ||
               this->pad_bottom == -0xea) {
        iVar12 = iVar8 / 2;
        iVar22 = iVar8 - iVar12;
        iVar8 = iVar7 / 2;
        iVar27 = iVar7 - iVar8;
        goto LAB_0016ba3b;
      }
      if (pMVar19->data == (void *)0x0) goto LAB_0016bad6;
      iVar8 = pMVar19->c;
      sVar5 = pMVar19->cstep;
      Mat::~Mat(&local_168);
      if ((long)iVar8 * sVar5 == 0) goto LAB_0016bae3;
    }
LAB_0016bb1c:
    iVar8 = 0;
  }
  else {
    local_168.data = (void *)local_218._0_8_;
    local_168.elemsize = local_218._16_8_;
    local_168.elempack = local_218._24_4_;
    local_168.allocator = (Allocator *)local_1f8._0_8_;
    local_168.dims = local_1f8._8_4_;
    local_168.w = local_1f8._12_4_;
    local_168.h = local_1e8._0_4_;
    local_168.c = local_1e8._4_4_;
    local_168.cstep = local_1e8._8_8_;
    if ((int *)local_218._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_218._8_8_ = *(int *)local_218._8_8_ + 1;
      UNLOCK();
    }
    local_1f8 = auVar40;
    local_1e8 = auVar46;
    local_168.refcount = (int *)local_218._8_8_;
    if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
LAB_0016b818:
      copy_cut_border(&local_168,pMVar19,this->pad_top,this->pad_bottom,this->pad_left,
                      this->pad_right,opt_00);
      if ((pMVar19->data == (void *)0x0) || (bVar33 = true, (long)pMVar19->c * pMVar19->cstep == 0))
      {
        bVar33 = false;
      }
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (**(code **)(*(long *)local_168.allocator + 0x18))();
          }
        }
      }
      iVar8 = -100;
      if (bVar33) goto LAB_0016bb1c;
    }
    else {
      opt_b.use_int8_arithmetic = local_f0->use_int8_arithmetic;
      opt_b.use_packing_layout = local_f0->use_packing_layout;
      opt_b.use_shader_pack8 = local_f0->use_shader_pack8;
      opt_b.use_bf16_storage = local_f0->use_bf16_storage;
      opt_b._36_4_ = *(undefined4 *)&local_f0->field_0x24;
      opt_b.lightmode = local_f0->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_f0->field_0x1;
      opt_b.num_threads = local_f0->num_threads;
      opt_b.workspace_allocator = local_f0->workspace_allocator;
      opt_b.use_winograd_convolution = local_f0->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_f0->use_sgemm_convolution;
      opt_b.use_int8_inference = local_f0->use_int8_inference;
      opt_b.use_vulkan_compute = local_f0->use_vulkan_compute;
      opt_b.use_fp16_packed = local_f0->use_fp16_packed;
      opt_b.use_fp16_storage = local_f0->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_f0->use_fp16_arithmetic;
      opt_b.use_int8_storage = local_f0->use_int8_storage;
      opt_b.blob_allocator = local_f0->workspace_allocator;
      copy_make_border((Mat *)local_218,&local_168,0,this->output_pad_bottom,0,
                       this->output_pad_right,0,0.0,&opt_b);
      if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0))
      goto LAB_0016b818;
LAB_0016bad6:
      Mat::~Mat(&local_168);
LAB_0016bae3:
      iVar8 = -100;
    }
  }
LAB_0016bb1f:
  piVar31 = (int *)local_218._8_8_;
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    piVar31 = (int *)local_218._8_8_;
  }
LAB_0016bb41:
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if ((Allocator *)local_1f8._0_8_ == (Allocator *)0x0) {
        if ((void *)local_218._0_8_ != (void *)0x0) {
          free((void *)local_218._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_1f8._0_8_ + 0x18))();
      }
    }
  }
  return iVar8;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}